

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::DestroyProtos(RepeatedPtrFieldBase *this)

{
  int iVar1;
  LogMessage *pLVar2;
  long lVar3;
  Rep *pRVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x66);
    pLVar2 = LogMessage::operator<<(&local_58,"CHECK failed: rep_: ");
    LogFinisher::operator=(&local_59,pLVar2);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x67);
    pLVar2 = LogMessage::operator<<(&local_58,"CHECK failed: arena_ == nullptr: ");
    LogFinisher::operator=(&local_59,pLVar2);
    LogMessage::~LogMessage(&local_58);
  }
  pRVar4 = this->rep_;
  iVar1 = pRVar4->allocated_size;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if ((long *)pRVar4->elements[lVar3] != (long *)0x0) {
        (**(code **)(*pRVar4->elements[lVar3] + 8))();
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
    pRVar4 = this->rep_;
  }
  operator_delete(pRVar4);
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::DestroyProtos() {
  GOOGLE_DCHECK(rep_);
  GOOGLE_DCHECK(arena_ == nullptr);
  int n = rep_->allocated_size;
  void* const* elements = rep_->elements;
  for (int i = 0; i < n; i++) {
    delete static_cast<MessageLite*>(elements[i]);
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
  ::operator delete(static_cast<void*>(rep_), size);
  rep_ = nullptr;
#else
  ::operator delete(static_cast<void*>(rep_));
  rep_ = nullptr;
#endif
}